

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O1

int * Fraig_ManSaveCounterExample(Fraig_Man_t *p,Fraig_Node_t *pNode)

{
  Fraig_Node_t **ppFVar1;
  uint uVar2;
  int iVar3;
  int *pModel;
  long lVar4;
  long lVar5;
  uint fCompl;
  size_t __size;
  
  fCompl = ~(uint)pNode & 1;
  __size = (long)p->vInputs->nSize << 2;
  pModel = (int *)malloc(__size);
  memset(pModel,0,__size);
  uVar2 = Fraig_FindFirstDiff(p->pConst1,(Fraig_Node_t *)((ulong)pNode & 0xfffffffffffffffe),fCompl,
                              p->nWordsRand,1);
  if ((int)uVar2 < 0) {
    uVar2 = Fraig_FindFirstDiff(p->pConst1,(Fraig_Node_t *)((ulong)pNode & 0xfffffffffffffffe),
                                fCompl,p->iWordStart,0);
    if ((int)uVar2 < 0) {
      if (pModel != (int *)0x0) {
        free(pModel);
      }
      pModel = (int *)0x0;
    }
    else {
      lVar5 = (long)p->vInputs->nSize;
      if (0 < lVar5) {
        ppFVar1 = p->vInputs->pArray;
        lVar4 = 0;
        do {
          if ((ppFVar1[lVar4]->puSimD[uVar2 >> 5] & 1 << ((byte)uVar2 & 0x1f)) != 0) {
            pModel[lVar4] = 1;
          }
          lVar4 = lVar4 + 1;
        } while (lVar5 != lVar4);
      }
      iVar3 = Fraig_ManSimulateBitNode(p,pNode,pModel);
      if (iVar3 == 0) {
        __assert_fail("Fraig_ManSimulateBitNode( p, pNode, pModel )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                      ,900,"int *Fraig_ManSaveCounterExample(Fraig_Man_t *, Fraig_Node_t *)");
      }
    }
  }
  else {
    lVar5 = (long)p->vInputs->nSize;
    if (0 < lVar5) {
      ppFVar1 = p->vInputs->pArray;
      lVar4 = 0;
      do {
        if ((ppFVar1[lVar4]->puSimR[uVar2 >> 5] & 1 << ((byte)uVar2 & 0x1f)) != 0) {
          pModel[lVar4] = 1;
        }
        lVar4 = lVar4 + 1;
      } while (lVar5 != lVar4);
    }
    iVar3 = Fraig_ManSimulateBitNode(p,pNode,pModel);
    if (iVar3 == 0) {
      __assert_fail("Fraig_ManSimulateBitNode( p, pNode, pModel )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                    ,0x375,"int *Fraig_ManSaveCounterExample(Fraig_Man_t *, Fraig_Node_t *)");
    }
  }
  return pModel;
}

Assistant:

int * Fraig_ManSaveCounterExample( Fraig_Man_t * p, Fraig_Node_t * pNode )
{
    int * pModel;
    int iPattern;
    int i, fCompl;

    // the node can be complemented
    fCompl = Fraig_IsComplement(pNode);
    // because we compare with constant 0, p->pConst1 should also be complemented
    fCompl = !fCompl;

    // derive the model
    pModel = Fraig_ManAllocCounterExample( p );
    iPattern = Fraig_FindFirstDiff( p->pConst1, Fraig_Regular(pNode), fCompl, p->nWordsRand, 1 );
    if ( iPattern >= 0 )
    {
        for ( i = 0; i < p->vInputs->nSize; i++ )
            if ( Fraig_BitStringHasBit( p->vInputs->pArray[i]->puSimR, iPattern ) )
                pModel[i] = 1;
/*
printf( "SAT solver's pattern:\n" );
for ( i = 0; i < p->vInputs->nSize; i++ )
    printf( "%d", pModel[i] );
printf( "\n" );
*/
        assert( Fraig_ManSimulateBitNode( p, pNode, pModel ) );
        return pModel;
    }
    iPattern = Fraig_FindFirstDiff( p->pConst1, Fraig_Regular(pNode), fCompl, p->iWordStart, 0 );
    if ( iPattern >= 0 )
    {
        for ( i = 0; i < p->vInputs->nSize; i++ )
            if ( Fraig_BitStringHasBit( p->vInputs->pArray[i]->puSimD, iPattern ) )
                pModel[i] = 1;
/*
printf( "SAT solver's pattern:\n" );
for ( i = 0; i < p->vInputs->nSize; i++ )
    printf( "%d", pModel[i] );
printf( "\n" );
*/
        assert( Fraig_ManSimulateBitNode( p, pNode, pModel ) );
        return pModel;
    }
    ABC_FREE( pModel );
    return NULL;
}